

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataTemplatedWithinCollectionGather<bool>
               (TupleDataLayout *param_1,Vector *heap_locations,idx_t list_size_before,
               SelectionVector *param_4,idx_t scan_count,Vector *target,SelectionVector *target_sel,
               optional_ptr<duckdb::Vector,_true> list_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *param_9)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  long lVar4;
  bool bVar5;
  Vector *pVVar6;
  ulong uVar7;
  idx_t child_i;
  ulong uVar8;
  idx_t row_idx;
  idx_t iVar9;
  long lVar10;
  ValidityBytes source_mask;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  ulong local_40;
  optional_ptr<duckdb::Vector,_true> local_38;
  
  local_38.ptr = list_vector.ptr;
  pVVar6 = optional_ptr<duckdb::Vector,_true>::operator*(&local_38);
  pdVar1 = pVVar6->data;
  pVVar6 = optional_ptr<duckdb::Vector,_true>::operator*(&local_38);
  FlatVector::VerifyFlatVector(pVVar6);
  pdVar2 = heap_locations->data;
  pdVar3 = target->data;
  FlatVector::VerifyFlatVector(target);
  for (iVar9 = 0; iVar9 != scan_count; iVar9 = iVar9 + 1) {
    row_idx = iVar9;
    if (target_sel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)target_sel->sel_vector[iVar9];
    }
    bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(pVVar6->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar5) {
      uVar7 = *(ulong *)(pdVar1 + row_idx * 0x10 + 8);
      if (uVar7 != 0) {
        lVar4 = *(long *)(pdVar2 + iVar9 * 8);
        _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        lVar10 = (uVar7 + 7 >> 3) + lVar4;
        *(ulong *)(pdVar2 + iVar9 * 8) = lVar10 + uVar7;
        local_40 = uVar7;
        for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
          if ((*(byte *)(lVar4 + (uVar8 >> 3)) >> ((uint)uVar8 & 7) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(target->validity).super_TemplatedValidityMask<unsigned_long>,
                       list_size_before + uVar8);
            uVar7 = *(ulong *)(pdVar1 + row_idx * 0x10 + 8);
          }
          else {
            pdVar3[uVar8 + list_size_before] = *(byte *)(lVar10 + uVar8) & 1;
          }
        }
        list_size_before = list_size_before + uVar7;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48);
      }
    }
  }
  return;
}

Assistant:

static void
TupleDataTemplatedWithinCollectionGather(const TupleDataLayout &, Vector &heap_locations, const idx_t list_size_before,
                                         const SelectionVector &, const idx_t scan_count, Vector &target,
                                         const SelectionVector &target_sel, optional_ptr<Vector> list_vector,
                                         const vector<TupleDataGatherFunction> &) {
	// List parent
	const auto list_entries = FlatVector::GetData<list_entry_t>(*list_vector);
	const auto &list_validity = FlatVector::Validity(*list_vector);

	// Source
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Target
	const auto target_data = FlatVector::GetData<T>(target);
	auto &target_validity = FlatVector::Validity(target);

	uint64_t target_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto target_idx = target_sel.get_index(i);
		if (!list_validity.RowIsValid(target_idx)) {
			continue;
		}

		const auto &list_length = list_entries[target_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask
		auto &source_heap_location = source_heap_locations[i];
		ValidityBytes source_mask(source_heap_location, list_length);
		source_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Get the start to the fixed-size data and skip the heap pointer over it
		const auto source_data_location = source_heap_location;
		source_heap_location += list_length * TupleDataWithinListFixedSize<T>();

		// Load the child validity and data belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			if (source_mask.RowIsValidUnsafe(child_i)) {
				auto &target_value = target_data[target_offset + child_i];
				target_value = TupleDataWithinListValueLoad<T>(
				    source_data_location + child_i * TupleDataWithinListFixedSize<T>(), source_heap_location);
				TupleDataValueVerify(target.GetType(), target_value);
			} else {
				target_validity.SetInvalid(target_offset + child_i);
			}
		}
		target_offset += list_length;
	}
}